

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O3

void duckdb_re2::ConvertRunesToBytes(bool latin1,Rune *runes,int nrunes,string *bytes)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  pointer str;
  undefined7 in_register_00000039;
  
  if ((int)CONCAT71(in_register_00000039,latin1) == 0) {
    std::__cxx11::string::resize((ulong)bytes,(char)nrunes * '\x04');
    str = (bytes->_M_dataplus)._M_p;
    if (nrunes < 1) {
      cVar1 = (char)str;
    }
    else {
      uVar3 = (ulong)(uint)nrunes;
      do {
        iVar2 = runetochar(str,runes);
        str = str + iVar2;
        runes = runes + 1;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
      cVar1 = (char)(bytes->_M_dataplus)._M_p;
    }
    std::__cxx11::string::resize((ulong)bytes,(char)str - cVar1);
    std::__cxx11::string::reserve();
  }
  else {
    std::__cxx11::string::resize((ulong)bytes,(char)nrunes);
    if (0 < nrunes) {
      uVar3 = 0;
      do {
        (bytes->_M_dataplus)._M_p[uVar3] = (char)runes[uVar3];
        uVar3 = uVar3 + 1;
      } while ((uint)nrunes != uVar3);
    }
  }
  return;
}

Assistant:

void ConvertRunesToBytes(bool latin1, Rune* runes, int nrunes,
                         std::string* bytes) {
  if (latin1) {
    bytes->resize(nrunes);
    for (int i = 0; i < nrunes; i++)
      (*bytes)[i] = static_cast<char>(runes[i]);
  } else {
    bytes->resize(nrunes * UTFmax);  // worst case
    char* p = &(*bytes)[0];
    for (int i = 0; i < nrunes; i++)
      p += runetochar(p, &runes[i]);
    bytes->resize(p - &(*bytes)[0]);
    bytes->shrink_to_fit();
  }
}